

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_enumerator.cpp
# Opt level: O3

bool __thiscall duckdb::PlanEnumerator::EmitCSG(PlanEnumerator *this,JoinRelationSet *node)

{
  pointer puVar1;
  pointer puVar2;
  PlanEnumerator *pPVar3;
  bool bVar4;
  reference pvVar5;
  JoinRelationSet *other;
  ulong uVar6;
  JoinRelationSet *pJVar7;
  size_type __n;
  long lVar8;
  JoinRelationSet *pJVar9;
  vector<unsigned_long,_true> neighbors;
  __alloc_node_gen_t __alloc_node_gen;
  unsigned_long neighbor;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  new_exclusion_set;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  exclusion_set;
  vector<unsigned_long,_true> local_e0;
  PlanEnumerator *local_c8;
  vector<std::reference_wrapper<duckdb::NeighborInfo>,_true> local_c0;
  _Head_base<0UL,_unsigned_long_*,_false> local_a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  bVar4 = true;
  if (node->count !=
      (long)(this->query_graph_manager->relation_manager).relations.
            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->query_graph_manager->relation_manager).relations.
            super_vector<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SingleJoinRelation,_std::default_delete<duckdb::SingleJoinRelation>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3) {
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8 = this;
    if (*(unsigned_long *)
         (node->relations).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
         super__Head_base<0UL,_unsigned_long_*,_false> != 0) {
      do {
        local_a0._M_buckets = (__buckets_ptr)&local_68;
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,&local_e0,&local_a0);
        local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start + 1);
      } while (local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start <
               *(unsigned_long *)
                (node->relations).
                super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                super__Head_base<0UL,_unsigned_long_*,_false>);
    }
    local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)node;
    optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
              ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_e0);
    if (*(idx_t *)((long)local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start + 8) != 0) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_e0);
        local_a0._M_buckets = (__buckets_ptr)&local_68;
        ::std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_68,
                   (long)(((unsafe_unique_array<idx_t> *)
                          local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start)->
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>).
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false> + lVar8,&local_a0);
        optional_ptr<duckdb::JoinRelationSet,_true>::CheckValid
                  ((optional_ptr<duckdb::JoinRelationSet,_true> *)&local_e0);
        uVar6 = uVar6 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar6 < *(idx_t *)((long)local_e0.
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 8));
    }
    QueryGraphEdges::GetNeighbors
              (&local_e0,local_c8->query_graph,node,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)&local_68);
    puVar2 = local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar1 = local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar4 = true;
    }
    else {
      uVar6 = (long)local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar8 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                (local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      ::std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
                (puVar1,puVar2);
      local_a0._M_buckets = (__buckets_ptr)0x0;
      local_a0._M_bucket_count = local_68._M_bucket_count;
      local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_a0._M_element_count = local_68._M_element_count;
      local_a0._M_rehash_policy._4_4_ = local_68._M_rehash_policy._4_4_;
      local_a0._M_rehash_policy._M_max_load_factor = local_68._M_rehash_policy._M_max_load_factor;
      local_a0._M_rehash_policy._M_next_resize = local_68._M_rehash_policy._M_next_resize;
      local_a0._M_single_bucket = (__node_base_ptr)0x0;
      local_c0.
      super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_a0;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_assign<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_a0,&local_68,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,_false>_>_> *)
                 &local_c0);
      pJVar7 = (JoinRelationSet *)
               local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n = 0;
        do {
          pvVar5 = vector<unsigned_long,_true>::operator[](&local_e0,__n);
          local_c0.
          super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
          .
          super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_a0;
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&local_a0,pvVar5,&local_c0);
          __n = __n + 1;
          pJVar7 = (JoinRelationSet *)
                   local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        } while (__n < (ulong)((long)local_e0.
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_e0.
                                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      pPVar3 = local_c8;
      bVar4 = true;
      if ((JoinRelationSet *)
          local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != pJVar7) {
        pJVar9 = (JoinRelationSet *)
                 local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          local_a8._M_head_impl =
               (pJVar9->relations).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          other = JoinRelationSetManager::GetJoinRelation
                            (&pPVar3->query_graph_manager->set_manager,(idx_t)local_a8._M_head_impl)
          ;
          QueryGraphEdges::GetConnections(&local_c0,pPVar3->query_graph,node,other);
          if (local_c0.
              super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_c0.
              super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            uVar6 = local_c8->pairs + 1;
            local_c8->pairs = uVar6;
            if (uVar6 < 10000) {
              EmitPair(local_c8,node,other,&local_c0);
              goto LAB_00d00781;
            }
LAB_00d007d0:
            if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_c0.
                   super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                   .
                   super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)0x0) {
              operator_delete(local_c0.
                              super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                              .
                              super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar4 = false;
            goto LAB_00d007dd;
          }
LAB_00d00781:
          bVar4 = EnumerateCmpRecursive
                            (local_c8,node,other,
                             (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)&local_a0);
          if (!bVar4) goto LAB_00d007d0;
          ::std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::_M_erase(&local_a0,&local_a8);
          if ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)local_c0.
                 super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
              (_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)0x0) {
            operator_delete(local_c0.
                            super_vector<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                            .
                            super__Vector_base<std::reference_wrapper<duckdb::NeighborInfo>,_std::allocator<std::reference_wrapper<duckdb::NeighborInfo>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          pJVar9 = (JoinRelationSet *)&pJVar9->count;
        } while (pJVar9 != pJVar7);
        bVar4 = true;
      }
LAB_00d007dd:
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_a0);
    }
    if ((JoinRelationSet *)
        local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (JoinRelationSet *)0x0) {
      operator_delete(local_e0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ::std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return bVar4;
}

Assistant:

bool PlanEnumerator::EmitCSG(JoinRelationSet &node) {
	if (node.count == query_graph_manager.relation_manager.NumRelations()) {
		return true;
	}
	// create the exclusion set as everything inside the subgraph AND anything with members BELOW it
	unordered_set<idx_t> exclusion_set;
	for (idx_t i = 0; i < node.relations[0]; i++) {
		exclusion_set.insert(i);
	}
	UpdateExclusionSet(&node, exclusion_set);
	// find the neighbors given this exclusion set
	auto neighbors = query_graph.GetNeighbors(node, exclusion_set);
	if (neighbors.empty()) {
		return true;
	}

	//! Neighbors should be reversed when iterating over them.
	std::sort(neighbors.begin(), neighbors.end(), std::greater<idx_t>());
	for (idx_t i = 0; i < neighbors.size() - 1; i++) {
		D_ASSERT(neighbors[i] > neighbors[i + 1]);
	}

	// Dphyp paper missing this.
	// Because we are traversing in reverse order, we need to add neighbors whose number is smaller than the current
	// node to exclusion_set
	// This avoids duplicated enumeration
	unordered_set<idx_t> new_exclusion_set = exclusion_set;
	for (idx_t i = 0; i < neighbors.size(); ++i) {
		D_ASSERT(new_exclusion_set.find(neighbors[i]) == new_exclusion_set.end());
		new_exclusion_set.insert(neighbors[i]);
	}

	for (auto neighbor : neighbors) {
		// since the GetNeighbors only returns the smallest element in a list, the entry might not be connected to
		// (only!) this neighbor,  hence we have to do a connectedness check before we can emit it
		auto &neighbor_relation = query_graph_manager.set_manager.GetJoinRelation(neighbor);
		auto connections = query_graph.GetConnections(node, neighbor_relation);
		if (!connections.empty()) {
			if (!TryEmitPair(node, neighbor_relation, connections)) {
				return false;
			}
		}

		if (!EnumerateCmpRecursive(node, neighbor_relation, new_exclusion_set)) {
			return false;
		}

		new_exclusion_set.erase(neighbor);
	}
	return true;
}